

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_get_key_from_slot
          (psa_key_handle_t handle,psa_key_slot_t **p_slot,psa_key_usage_t usage,psa_algorithm_t alg
          )

{
  int iVar1;
  psa_key_slot_t *local_30;
  psa_key_slot_t *slot;
  psa_algorithm_t local_20;
  psa_status_t status;
  psa_algorithm_t alg_local;
  psa_key_usage_t usage_local;
  psa_key_slot_t **p_slot_local;
  psa_key_handle_t handle_local;
  
  local_30 = (psa_key_slot_t *)0x0;
  *p_slot = (psa_key_slot_t *)0x0;
  local_20 = alg;
  status = usage;
  _alg_local = p_slot;
  p_slot_local._2_2_ = handle;
  slot._4_4_ = psa_get_key_slot(handle,&local_30);
  p_slot_local._4_4_ = slot._4_4_;
  if (slot._4_4_ == 0) {
    if (((local_30->attr).type & 0x7000) == 0x4000) {
      status = status & 0xfffffffe;
    }
    if (((local_30->attr).policy.usage & status) == status) {
      if ((local_20 == 0) ||
         (iVar1 = psa_key_policy_permits(&(local_30->attr).policy,local_20), iVar1 != 0)) {
        *_alg_local = local_30;
        p_slot_local._4_4_ = 0;
      }
      else {
        p_slot_local._4_4_ = -0x85;
      }
    }
    else {
      p_slot_local._4_4_ = -0x85;
    }
  }
  return p_slot_local._4_4_;
}

Assistant:

static psa_status_t psa_get_key_from_slot( psa_key_handle_t handle,
                                           psa_key_slot_t **p_slot,
                                           psa_key_usage_t usage,
                                           psa_algorithm_t alg )
{
    psa_status_t status;
    psa_key_slot_t *slot = NULL;

    *p_slot = NULL;

    status = psa_get_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    /* Enforce that usage policy for the key slot contains all the flags
     * required by the usage parameter. There is one exception: public
     * keys can always be exported, so we treat public key objects as
     * if they had the export flag. */
    if( PSA_KEY_TYPE_IS_PUBLIC_KEY( slot->attr.type ) )
        usage &= ~PSA_KEY_USAGE_EXPORT;
    if( ( slot->attr.policy.usage & usage ) != usage )
        return( PSA_ERROR_NOT_PERMITTED );

    /* Enforce that the usage policy permits the requested algortihm. */
    if( alg != 0 && ! psa_key_policy_permits( &slot->attr.policy, alg ) )
        return( PSA_ERROR_NOT_PERMITTED );

    *p_slot = slot;
    return( PSA_SUCCESS );
}